

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportFunc
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_140;
  string local_138;
  string local_118;
  ImportType local_f8;
  reference local_b0;
  FuncType *func_type;
  Var local_88;
  Enum local_40;
  Index local_3c;
  BinaryReaderInterp *pBStack_38;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderInterp *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  local_3c = import_index;
  pBStack_38 = this;
  Location::Location((Location *)&func_type);
  Var::Var(&local_88,sig_index,(Location *)&func_type);
  local_40 = (Enum)SharedValidator::OnFunction
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_88);
  bVar2 = Failed((Result)local_40);
  Var::~Var(&local_88);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Error);
  }
  else {
    local_b0 = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
               operator[](&this->module_->func_types,(ulong)sig_index);
    pMVar1 = this->module_;
    string_view::to_string_abi_cxx11_(&local_118,(string_view *)&field_name_local.size_);
    string_view::to_string_abi_cxx11_(&local_138,(string_view *)&this_local);
    (*(local_b0->super_ExternType)._vptr_ExternType[2])(&local_140);
    ImportType::ImportType(&local_f8,&local_118,&local_138,&local_140);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_f8);
    ImportDesc::~ImportDesc((ImportDesc *)&local_f8);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr(&local_140);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,local_b0);
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  }
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportFunc(Index import_index,
                                        string_view module_name,
                                        string_view field_name,
                                        Index func_index,
                                        Index sig_index) {
  CHECK_RESULT(validator_.OnFunction(loc, Var(sig_index)));
  FuncType& func_type = module_.func_types[sig_index];
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), func_type.Clone())});
  func_types_.push_back(func_type);
  return Result::Ok;
}